

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall Memory::LargeHeapBlock::WBSetBitRange(LargeHeapBlock *this,char *addr,uint count)

{
  int iVar1;
  BVIndex i;
  AutoNestedHandledExceptionType local_24 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  iVar1 = *(int *)&(this->super_HeapBlock).address;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_24,ExceptionType_DisableCheck);
  CCLock::Enter(&wbVerifyBitsLock.super_CCLock);
  if (count != 0) {
    i = (uint)((int)addr - iVar1) >> 3;
    do {
      BVSparse<Memory::HeapAllocator>::Set(&this->wbVerifyBits,i);
      i = i + 1;
      count = count - 1;
    } while (count != 0);
  }
  CCLock::Leave(&wbVerifyBitsLock.super_CCLock);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_24);
  return;
}

Assistant:

void LargeHeapBlock::WBSetBitRange(char* addr, uint count)
{
    uint index = (uint)(addr - this->address) / sizeof(void*);
    try
    {
        AUTO_NESTED_HANDLED_EXCEPTION_TYPE(static_cast<ExceptionType>(ExceptionType_DisableCheck));
        AutoCriticalSection autoCs(&wbVerifyBitsLock);
        for (uint i = 0; i < count; i++)
        {
            wbVerifyBits.Set(index + i);
        }
    }
    catch (Js::OutOfMemoryException&)
    {
    }
}